

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index row,Index col)

{
  Scalar SVar1;
  ConstColXpr local_118;
  ConstRowXpr local_e8;
  ConstTransposeReturnType local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>
  local_88;
  Index local_20;
  Index col_local;
  Index row_local;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  *this_local;
  
  local_20 = col;
  col_local = row;
  row_local = (Index)this;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            (&local_e8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this->m_lhs,row);
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (&local_b8,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             &local_e8);
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::col
            (&local_118,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this->m_rhs,local_20);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,1,3,false>const>>::
  cwiseProduct<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,3,1,true>>
            (&local_88,&local_b8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_> *)
             &local_118);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_3,_1,_true>_>_>
                 *)&local_88);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index row, Index col) const
  {
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }